

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

char * __thiscall cmGeneratorTarget::GetLocation(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  string local_58;
  string local_38;
  string *local_18;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  local_18 = config;
  config_local = (string *)this;
  if (GetLocation(std::__cxx11::string_const&)::location_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&GetLocation(std::__cxx11::string_const&)::location_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::string::string
                ((string *)&GetLocation(std::__cxx11::string_const&)::location_abi_cxx11_);
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetLocation(std::__cxx11::string_const&)::location_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetLocation(std::__cxx11::string_const&)::location_abi_cxx11_);
    }
  }
  bVar1 = IsImported(this);
  if (bVar1) {
    cmTarget::ImportedGetFullPath(&local_38,this->Target,local_18,RuntimeBinaryArtifact);
    std::__cxx11::string::operator=
              ((string *)&GetLocation(std::__cxx11::string_const&)::location_abi_cxx11_,
               (string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    GetFullPath(&local_58,this,local_18,RuntimeBinaryArtifact,false);
    std::__cxx11::string::operator=
              ((string *)&GetLocation(std::__cxx11::string_const&)::location_abi_cxx11_,
               (string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  return pcVar3;
}

Assistant:

const char* cmGeneratorTarget::GetLocation(const std::string& config) const
{
  static std::string location;
  if (this->IsImported()) {
    location = this->Target->ImportedGetFullPath(
      config, cmStateEnums::RuntimeBinaryArtifact);
  } else {
    location = this->GetFullPath(config, cmStateEnums::RuntimeBinaryArtifact);
  }
  return location.c_str();
}